

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O2

void __thiscall
ut11::Mock<void(TestEvent<1>)>::VerifyTimes<int,ut11::Operands::IsAny<TestEvent<1>>>
          (Mock<void(TestEvent<1>)> *this,size_t param_2,string *param_3,int *param_4)

{
  size_t actual;
  string sStack_68;
  string local_48;
  
  actual = detail::MockArgumentHandler<TestEvent<1>>::
           CountCalls<ut11::Operands::IsAny<TestEvent<1>>>
                     ((MockArgumentHandler<TestEvent<1>_> *)(this + 0x20));
  if (actual != (long)*param_4) {
    std::__cxx11::string::string((string *)&local_48,param_3);
    GetVerifyFailTimesMessageForCount_abi_cxx11_(&sStack_68,this,(long)*param_4,actual);
    Assert::Fail(param_2,&local_48,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void VerifyTimes(std::true_type isOperand, std::size_t line, std::string file, const Count& count, const Expectations&... expectations) const
		{
			auto actual = m_argumentHandler.CountCalls(expectations...);
			if ( actual != count )
				Assert::Fail(line, file, GetVerifyFailTimesMessageForCount(count, actual));
		}